

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ostream * Catch::operator<<(ostream *os,Version *version)

{
  char *__s;
  ostream *poVar1;
  size_t sVar2;
  char local_2c [4];
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  local_2c[3] = 0x2e;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2c + 3,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  local_2c[2] = 0x2e;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2c + 2,1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  if (*version->branchName != '\0') {
    local_2c[1] = 0x2d;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,local_2c + 1,1);
    __s = version->branchName;
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
    }
    local_2c[0] = '.';
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2c,1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  return os;
}

Assistant:

std::ostream& operator << (std::ostream& os, Version const& version) {
        os << version.majorVersion << '.'
            << version.minorVersion << '.'
            << version.patchNumber;
        // branchName is never null -> 0th char is \0 if it is empty
        if (version.branchName[0]) {
            os << '-' << version.branchName
                << '.' << version.buildNumber;
        }
        return os;
    }